

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topn_optimizer.cpp
# Opt level: O3

bool duckdb::TopN::CanOptimize(LogicalOperator *op)

{
  idx_t iVar1;
  LogicalLimit *pLVar2;
  reference pvVar3;
  idx_t iVar4;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  if (op->type == LOGICAL_LIMIT) {
    pLVar2 = LogicalOperator::Cast<duckdb::LogicalLimit>(op);
    bVar6 = false;
    if (((pLVar2->limit_val).type == CONSTANT_VALUE) &&
       (bVar6 = false, (pLVar2->offset_val).type != EXPRESSION_VALUE)) {
      bVar6 = false;
      pvVar3 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](&op->children,0);
      _Var5._M_head_impl =
           (pvVar3->
           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
           ._M_t.
           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      iVar4 = BoundLimitNode::GetConstantValue(&pLVar2->limit_val);
      if ((iVar4 < 0x1389) ||
         (auVar7._8_4_ = (int)(iVar4 >> 0x20), auVar7._0_8_ = iVar4, auVar7._12_4_ = 0x45300000,
         iVar1 = (_Var5._M_head_impl)->estimated_cardinality, auVar8._8_4_ = (int)(iVar1 >> 0x20),
         auVar8._0_8_ = iVar1, auVar8._12_4_ = 0x45300000,
         (auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)iVar4) - 4503599627370496.0) <=
         ((auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)iVar1) - 4503599627370496.0)) * 0.007)) {
        while ((_Var5._M_head_impl)->type == LOGICAL_PROJECTION) {
          pvVar3 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                   ::operator[](&(_Var5._M_head_impl)->children,0);
          _Var5._M_head_impl =
               (pvVar3->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        }
        bVar6 = (_Var5._M_head_impl)->type == LOGICAL_ORDER_BY;
      }
    }
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool TopN::CanOptimize(LogicalOperator &op) {
	if (op.type == LogicalOperatorType::LOGICAL_LIMIT) {
		auto &limit = op.Cast<LogicalLimit>();

		if (limit.limit_val.Type() != LimitNodeType::CONSTANT_VALUE) {
			// we need LIMIT to be present AND be a constant value for us to be able to use Top-N
			return false;
		}
		if (limit.offset_val.Type() == LimitNodeType::EXPRESSION_VALUE) {
			// we need offset to be either not set (i.e. limit without offset) OR have offset be
			return false;
		}

		auto child_op = op.children[0].get();

		auto constant_limit = static_cast<double>(limit.limit_val.GetConstantValue());
		auto child_card = static_cast<double>(child_op->estimated_cardinality);

		// if the child cardinality is not 98 times more than the
		bool limit_is_large = constant_limit > 5000;
		if (constant_limit > child_card * 0.007 && limit_is_large) {
			return false;
		}

		while (child_op->type == LogicalOperatorType::LOGICAL_PROJECTION) {
			D_ASSERT(!child_op->children.empty());
			child_op = child_op->children[0].get();
		}

		return child_op->type == LogicalOperatorType::LOGICAL_ORDER_BY;
	}
	return false;
}